

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_full_uri(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  size_t sVar1;
  curi_status cVar2;
  curi_status __TRY_tryStatus_1;
  size_t __TRY_initialOffset_1;
  curi_status __TRY_tryStatus;
  size_t __TRY_initialOffset;
  curi_status status;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  __TRY_initialOffset._4_4_ = parse_scheme(uri,len,offset,settings,userData);
  if (__TRY_initialOffset._4_4_ == curi_status_success) {
    __TRY_initialOffset._4_4_ = parse_char(':',uri,len,offset,settings,userData);
  }
  if (__TRY_initialOffset._4_4_ == curi_status_success) {
    __TRY_initialOffset._4_4_ = parse_hier_part(uri,len,offset,settings,userData);
  }
  cVar2 = __TRY_initialOffset._4_4_;
  if (__TRY_initialOffset._4_4_ == curi_status_success) {
    sVar1 = *offset;
    cVar2 = parse_query(uri,len,offset,settings,userData,1);
    if (cVar2 == curi_status_error) {
      *offset = sVar1;
      cVar2 = __TRY_initialOffset._4_4_;
    }
  }
  __TRY_initialOffset._4_4_ = cVar2;
  cVar2 = __TRY_initialOffset._4_4_;
  if (__TRY_initialOffset._4_4_ == curi_status_success) {
    sVar1 = *offset;
    cVar2 = parse_fragment(uri,len,offset,settings,userData);
    if (cVar2 == curi_status_error) {
      *offset = sVar1;
      cVar2 = __TRY_initialOffset._4_4_;
    }
  }
  __TRY_initialOffset._4_4_ = cVar2;
  return __TRY_initialOffset._4_4_;
}

Assistant:

static curi_status parse_full_uri(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // URI = scheme ":" hier-part [ query ] [ fragment ]
    curi_status status = curi_status_success;

    if (status == curi_status_success)
        status = parse_scheme(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_char(':', uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_hier_part(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        TRY(status, offset, parse_query(uri, len, offset, settings, userData, 1));

    if (status == curi_status_success)
        TRY(status, offset, parse_fragment(uri, len, offset, settings, userData));

    return status;
}